

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O0

void __thiscall Example::displayScene(Example *this)

{
  size_t sVar1;
  CD_Pair *ptr;
  Point3 p2;
  Point3 p1;
  uint local_18;
  uint j;
  uint i;
  int collisionNbr;
  Example *this_local;
  
  sch::CD_Scene::sceneProximityQuery();
  local_18 = 0;
  while( true ) {
    sVar1 = sch::CD_Scene::size(&this->sObj);
    if (sVar1 <= local_18) break;
    for (p1.m_z._4_4_ = 0; p1.m_z._4_4_ < local_18; p1.m_z._4_4_ = p1.m_z._4_4_ + 1) {
      CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&p2.m_z);
      CD_Matrix::Vector3T<double,_false>::Vector3T((Vector3T<double,_false> *)&ptr);
      sch::CD_Scene::getWitnessPoints
                (&this->sObj,local_18,p1.m_z._4_4_,(Point3 *)&p2.m_z,(Point3 *)&ptr);
      sch::CD_Scene::operator()(&this->sObj,local_18,p1.m_z._4_4_);
      sch::CD_Pair::getDistanceWithoutPenetrationDepth();
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void Example::displayScene()
{
  //Calls the computation of the distance (including penertation and witness
  //points) for all the scene, it returns the number of collisions.
  //Other implementations of the scene management could be considered for
  //future versions.
  int collisionNbr = sObj.sceneProximityQuery();

  (void) collisionNbr; ///prevent warning for unused variable

  for (unsigned i=0; i<sObj.size(); ++i)
  {
    for (unsigned j=0; j<i; ++j)
    {
      //Our witness points
      Point3 p1,p2;

      //Get the SQUARED distance and witness points of the last proximity
      //query (see example0.cpp for details on output interpretation)
      //Warning: this does not recompute the distance, even if one object
      //moved after the scene proximity query.
      sObj.getWitnessPoints(i,j,p1,p2);

      //We can get access to the pairs of objects. This will recompute the
      //distance if the objects moved. See example0 for details on how to
      //use the pair object.
      CD_Pair * ptr = sObj(i,j);
      ptr->getDistanceWithoutPenetrationDepth();
    }
  }
}